

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ActivationELU * __thiscall
CoreML::Specification::ActivationParams::mutable_elu(ActivationParams *this)

{
  ActivationLinear *this_00;
  
  if (this->_oneof_case_[0] == 0x32) {
    this_00 = (this->NonlinearityType_).linear_;
  }
  else {
    clear_NonlinearityType(this);
    this->_oneof_case_[0] = 0x32;
    this_00 = (ActivationLinear *)operator_new(0x18);
    ActivationELU::ActivationELU((ActivationELU *)this_00);
    (this->NonlinearityType_).elu_ = (ActivationELU *)this_00;
  }
  return (ActivationELU *)this_00;
}

Assistant:

inline ::CoreML::Specification::ActivationELU* ActivationParams::mutable_elu() {
  if (!has_elu()) {
    clear_NonlinearityType();
    set_has_elu();
    NonlinearityType_.elu_ = new ::CoreML::Specification::ActivationELU;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.ELU)
  return NonlinearityType_.elu_;
}